

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pffft.c
# Opt level: O0

void pffft_zreorder(PFFFT_Setup *setup,float *in,float *out,pffft_direction_t direction)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  int iVar8;
  int iVar9;
  float *pfVar10;
  int iVar11;
  long lVar12;
  v4sf tmp___5;
  int kk_1;
  v4sf tmp___4;
  int kk;
  v4sf tmp___3;
  v4sf tmp___2;
  v4sf tmp___1;
  v4sf tmp__;
  int dk;
  int k_1;
  v4sf *vout;
  v4sf *vin;
  int Ncvec;
  int N;
  int k;
  pffft_direction_t direction_local;
  float *out_local;
  float *in_local;
  PFFFT_Setup *setup_local;
  undefined4 local_b8;
  undefined4 uStack_b4;
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 local_78;
  undefined4 uStack_74;
  float fStack_60;
  float fStack_5c;
  float fStack_50;
  float fStack_4c;
  float fStack_40;
  float fStack_3c;
  float fStack_30;
  float fStack_2c;
  float fStack_20;
  float fStack_1c;
  float fStack_10;
  float fStack_c;
  
  iVar9 = setup->N;
  iVar8 = setup->Ncvec;
  if (in == out) {
    __assert_fail("in != out",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jcj83429[P]ShapingClipper/pffft.c"
                  ,0x51a,
                  "void pffft_zreorder(PFFFT_Setup *, const float *, float *, pffft_direction_t)");
  }
  if (setup->transform == PFFFT_REAL) {
    iVar8 = iVar9 / 0x20;
    if (direction == PFFFT_FORWARD) {
      for (tmp__[3] = 0.0; (int)tmp__[3] < iVar8; tmp__[3] = (float)((int)tmp__[3] + 1)) {
        local_78 = (undefined4)*(undefined8 *)(in + (long)((int)tmp__[3] << 3) * 4);
        uStack_74 = (undefined4)
                    ((ulong)*(undefined8 *)(in + (long)((int)tmp__[3] << 3) * 4) >> 0x20);
        local_88 = (undefined4)*(undefined8 *)(in + (long)((int)tmp__[3] << 3) * 4 + 4);
        uStack_84 = (undefined4)
                    ((ulong)*(undefined8 *)(in + (long)((int)tmp__[3] << 3) * 4 + 4) >> 0x20);
        fStack_10 = (float)*(undefined8 *)(in + (long)((int)tmp__[3] << 3) * 4 + 2);
        fStack_c = (float)((ulong)*(undefined8 *)(in + (long)((int)tmp__[3] << 3) * 4 + 2) >> 0x20);
        fStack_20 = (float)*(undefined8 *)(in + (long)((int)tmp__[3] << 3) * 4 + 6);
        fStack_1c = (float)((ulong)*(undefined8 *)(in + (long)((int)tmp__[3] << 3) * 4 + 6) >> 0x20)
        ;
        pfVar10 = out + (long)((int)tmp__[3] * 2) * 4 + 4;
        *pfVar10 = fStack_10;
        pfVar10[1] = fStack_20;
        pfVar10[2] = fStack_c;
        pfVar10[3] = fStack_1c;
        *(ulong *)(out + (long)((int)tmp__[3] * 2) * 4) = CONCAT44(local_88,local_78);
        *(ulong *)(out + (long)((int)tmp__[3] * 2) * 4 + 2) = CONCAT44(uStack_84,uStack_74);
        local_98 = (undefined4)*(undefined8 *)(in + (long)((int)tmp__[3] << 3) * 4 + 0x10);
        uStack_94 = (undefined4)
                    ((ulong)*(undefined8 *)(in + (long)((int)tmp__[3] << 3) * 4 + 0x10) >> 0x20);
        local_a8 = (undefined4)*(undefined8 *)(in + (long)((int)tmp__[3] << 3) * 4 + 0x14);
        uStack_a4 = (undefined4)
                    ((ulong)*(undefined8 *)(in + (long)((int)tmp__[3] << 3) * 4 + 0x14) >> 0x20);
        fStack_30 = (float)*(undefined8 *)(in + (long)((int)tmp__[3] << 3) * 4 + 0x12);
        fStack_2c = (float)((ulong)*(undefined8 *)(in + (long)((int)tmp__[3] << 3) * 4 + 0x12) >>
                           0x20);
        fStack_40 = (float)*(undefined8 *)(in + (long)((int)tmp__[3] << 3) * 4 + 0x16);
        fStack_3c = (float)((ulong)*(undefined8 *)(in + (long)((int)tmp__[3] << 3) * 4 + 0x16) >>
                           0x20);
        pfVar10 = out + (long)((iVar8 * 2 + (int)tmp__[3]) * 2 + 1) * 4;
        *pfVar10 = fStack_30;
        pfVar10[1] = fStack_40;
        pfVar10[2] = fStack_2c;
        pfVar10[3] = fStack_3c;
        *(ulong *)(out + (long)((iVar8 * 2 + (int)tmp__[3]) * 2) * 4) = CONCAT44(local_a8,local_98);
        *(ulong *)(out + (long)((iVar8 * 2 + (int)tmp__[3]) * 2) * 4 + 2) =
             CONCAT44(uStack_a4,uStack_94);
      }
      reversed_copy(iVar8,(v4sf *)(in + 8),8,(v4sf *)(out + iVar9 / 2));
      reversed_copy(iVar8,(v4sf *)(in + 0x18),8,(v4sf *)(out + iVar9));
    }
    else {
      for (tmp__[3] = 0.0; (int)tmp__[3] < iVar8; tmp__[3] = (float)((int)tmp__[3] + 1)) {
        fVar1 = in[(long)((int)tmp__[3] * 2) * 4];
        fVar2 = (in + (long)((int)tmp__[3] * 2) * 4)[2];
        fVar3 = in[(long)((int)tmp__[3] * 2) * 4 + 4];
        fVar4 = (in + (long)((int)tmp__[3] * 2) * 4 + 4)[2];
        lVar12 = (long)((int)tmp__[3] * 2);
        fVar5 = in[lVar12 * 4 + 3];
        fVar6 = in[lVar12 * 4 + 5];
        fVar7 = in[lVar12 * 4 + 7];
        pfVar10 = out + (long)((int)tmp__[3] << 3) * 4 + 4;
        *pfVar10 = in[lVar12 * 4 + 1];
        pfVar10[1] = fVar5;
        pfVar10[2] = fVar6;
        pfVar10[3] = fVar7;
        *(ulong *)(out + (long)((int)tmp__[3] << 3) * 4) = CONCAT44(fVar2,fVar1);
        *(ulong *)(out + (long)((int)tmp__[3] << 3) * 4 + 2) = CONCAT44(fVar4,fVar3);
        lVar12 = (long)(((int)tmp__[3] + iVar8 * 2) * 2);
        fVar1 = in[lVar12 * 4];
        fVar2 = (in + lVar12 * 4)[2];
        fVar3 = in[lVar12 * 4 + 4];
        fVar4 = (in + lVar12 * 4 + 4)[2];
        lVar12 = (long)(((int)tmp__[3] + iVar8 * 2) * 2);
        fVar5 = in[lVar12 * 4 + 3];
        fVar6 = in[lVar12 * 4 + 5];
        fVar7 = in[lVar12 * 4 + 7];
        pfVar10 = out + (long)((int)tmp__[3] * 8 + 5) * 4;
        *pfVar10 = in[lVar12 * 4 + 1];
        pfVar10[1] = fVar5;
        pfVar10[2] = fVar6;
        pfVar10[3] = fVar7;
        *(ulong *)(out + (long)((int)tmp__[3] * 8 + 4) * 4) = CONCAT44(fVar2,fVar1);
        *(ulong *)(out + (long)((int)tmp__[3] * 8 + 4) * 4 + 2) = CONCAT44(fVar4,fVar3);
      }
      unreversed_copy(iVar8,(v4sf *)(in + iVar9 / 4),(v4sf *)(out + (long)iVar9 + -0x18),-8);
      unreversed_copy(iVar8,(v4sf *)(in + (iVar9 * 3) / 4),(v4sf *)(out + (long)iVar9 + -8),-8);
    }
  }
  else if (direction == PFFFT_FORWARD) {
    for (Ncvec = 0; Ncvec < iVar8; Ncvec = Ncvec + 1) {
      iVar9 = Ncvec;
      if (Ncvec < 0) {
        iVar9 = Ncvec + 3;
      }
      iVar11 = iVar8;
      if (iVar8 < 0) {
        iVar11 = iVar8 + 3;
      }
      iVar9 = (iVar9 >> 2) + (Ncvec % 4) * (iVar11 >> 2);
      local_b8 = (undefined4)*(undefined8 *)(in + (long)(Ncvec * 2) * 4);
      uStack_b4 = (undefined4)((ulong)*(undefined8 *)(in + (long)(Ncvec * 2) * 4) >> 0x20);
      setup_local._0_4_ = (undefined4)*(undefined8 *)(in + (long)(Ncvec * 2) * 4 + 4);
      setup_local._4_4_ =
           (undefined4)((ulong)*(undefined8 *)(in + (long)(Ncvec * 2) * 4 + 4) >> 0x20);
      fStack_50 = (float)*(undefined8 *)(in + (long)(Ncvec * 2) * 4 + 2);
      fStack_4c = (float)((ulong)*(undefined8 *)(in + (long)(Ncvec * 2) * 4 + 2) >> 0x20);
      fStack_60 = (float)*(undefined8 *)(in + (long)(Ncvec * 2) * 4 + 6);
      fStack_5c = (float)((ulong)*(undefined8 *)(in + (long)(Ncvec * 2) * 4 + 6) >> 0x20);
      pfVar10 = out + (long)(iVar9 * 2 + 1) * 4;
      *pfVar10 = fStack_50;
      pfVar10[1] = fStack_60;
      pfVar10[2] = fStack_4c;
      pfVar10[3] = fStack_5c;
      *(ulong *)(out + (long)(iVar9 * 2) * 4) = CONCAT44(setup_local._0_4_,local_b8);
      *(ulong *)(out + (long)(iVar9 * 2) * 4 + 2) = CONCAT44(setup_local._4_4_,uStack_b4);
    }
  }
  else {
    for (Ncvec = 0; Ncvec < iVar8; Ncvec = Ncvec + 1) {
      iVar9 = Ncvec;
      if (Ncvec < 0) {
        iVar9 = Ncvec + 3;
      }
      iVar11 = iVar8;
      if (iVar8 < 0) {
        iVar11 = iVar8 + 3;
      }
      iVar9 = (iVar9 >> 2) + (Ncvec % 4) * (iVar11 >> 2);
      lVar12 = (long)(iVar9 * 2);
      fVar1 = in[lVar12 * 4];
      fVar2 = (in + lVar12 * 4)[2];
      fVar3 = in[lVar12 * 4 + 4];
      fVar4 = (in + lVar12 * 4 + 4)[2];
      lVar12 = (long)(iVar9 * 2);
      fVar5 = in[lVar12 * 4 + 3];
      fVar6 = in[lVar12 * 4 + 5];
      fVar7 = in[lVar12 * 4 + 7];
      pfVar10 = out + (long)(Ncvec * 2 + 1) * 4;
      *pfVar10 = in[lVar12 * 4 + 1];
      pfVar10[1] = fVar5;
      pfVar10[2] = fVar6;
      pfVar10[3] = fVar7;
      *(ulong *)(out + (long)(Ncvec << 1) * 4) = CONCAT44(fVar2,fVar1);
      *(ulong *)(out + (long)(Ncvec << 1) * 4 + 2) = CONCAT44(fVar4,fVar3);
    }
  }
  return;
}

Assistant:

void pffft_zreorder(PFFFT_Setup *setup, const float *in, float *out, pffft_direction_t direction) {
  int k, N = setup->N, Ncvec = setup->Ncvec;
  const v4sf *vin = (const v4sf*)in;
  v4sf *vout = (v4sf*)out;
  assert(in != out);
  if (setup->transform == PFFFT_REAL) {
    int k, dk = N/32;
    if (direction == PFFFT_FORWARD) {
      for (k=0; k < dk; ++k) {
        INTERLEAVE2(vin[k*8 + 0], vin[k*8 + 1], vout[2*(0*dk + k) + 0], vout[2*(0*dk + k) + 1]);
        INTERLEAVE2(vin[k*8 + 4], vin[k*8 + 5], vout[2*(2*dk + k) + 0], vout[2*(2*dk + k) + 1]);
      }
      reversed_copy(dk, vin+2, 8, (v4sf*)(out + N/2));
      reversed_copy(dk, vin+6, 8, (v4sf*)(out + N));
    } else {
      for (k=0; k < dk; ++k) {
        UNINTERLEAVE2(vin[2*(0*dk + k) + 0], vin[2*(0*dk + k) + 1], vout[k*8 + 0], vout[k*8 + 1]);
        UNINTERLEAVE2(vin[2*(2*dk + k) + 0], vin[2*(2*dk + k) + 1], vout[k*8 + 4], vout[k*8 + 5]);
      }
      unreversed_copy(dk, (v4sf*)(in + N/4), (v4sf*)(out + N - 6*SIMD_SZ), -8);
      unreversed_copy(dk, (v4sf*)(in + 3*N/4), (v4sf*)(out + N - 2*SIMD_SZ), -8);
    }
  } else {
    if (direction == PFFFT_FORWARD) {
      for (k=0; k < Ncvec; ++k) { 
        int kk = (k/4) + (k%4)*(Ncvec/4);
        INTERLEAVE2(vin[k*2], vin[k*2+1], vout[kk*2], vout[kk*2+1]);
      }
    } else {
      for (k=0; k < Ncvec; ++k) { 
        int kk = (k/4) + (k%4)*(Ncvec/4);
        UNINTERLEAVE2(vin[kk*2], vin[kk*2+1], vout[k*2], vout[k*2+1]);
      }
    }
  }
}